

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_composite_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx,
          Bitset *interpolation_qual)

{
  size_type *psVar1;
  uint uVar2;
  size_t sVar3;
  pointer pcVar4;
  SPIRType *pSVar5;
  bool bVar6;
  uint32_t uVar7;
  SPIRFunction *pSVar8;
  ulong uVar9;
  SPIRType *pSVar10;
  SPIRType *pSVar11;
  undefined8 extraout_RAX;
  undefined8 *puVar12;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *this_00;
  const_iterator cVar13;
  const_iterator cVar14;
  mapped_type *pmVar15;
  code **ppcVar16;
  runtime_error *prVar17;
  ulong uVar18;
  uint32_t uVar19;
  size_t sVar20;
  CompilerMSL *this_01;
  undefined8 uVar21;
  char (*pacVar22) [2];
  SPIRType *ts_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  bool local_24c;
  bool local_24b;
  bool local_24a;
  bool local_249;
  uint local_248;
  byte local_241;
  SPIRType *local_240;
  uint32_t local_234;
  undefined4 local_230;
  BuiltIn builtin;
  SPIRType *local_228;
  SPIRVariable *local_220;
  string var_chain_1;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  undefined4 local_1d4;
  string mbr_name;
  code *local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  undefined8 uStack_1a0;
  code **local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  code *pcStack_188;
  code **local_180;
  code *local_178;
  code *local_170;
  undefined1 uStack_168;
  undefined7 uStack_167;
  uint local_160;
  undefined4 uStack_15c;
  code *local_158;
  code *local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  code *pcStack_140;
  string var_chain;
  string local_f0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_d0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_c8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_c0;
  string flatten_from_ib_mbr_name;
  string local_90;
  Bitset local_70;
  
  ts_3 = var_type;
  local_240 = ib_type;
  local_220 = var;
  pSVar8 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  builtin = BuiltInMax;
  local_228 = var_type;
  local_241 = Compiler::is_member_builtin((Compiler *)this,var_type,mbr_idx,&builtin);
  local_249 = true;
  local_24b = true;
  if ((interpolation_qual->lower & 0x4000) == 0) {
    bVar6 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(local_228->super_IVariant).self.id,mbr_idx,
                       DecorationFlat);
    local_24b = true;
    if (!bVar6) {
      local_24b = Compiler::has_decoration
                            ((Compiler *)this,(ID)(local_220->super_IVariant).self.id,DecorationFlat
                            );
    }
  }
  if (((interpolation_qual->lower & 0x2000) == 0) &&
     (bVar6 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(local_228->super_IVariant).self.id,mbr_idx,
                         DecorationNoPerspective), !bVar6)) {
    local_249 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(local_220->super_IVariant).self.id,
                           DecorationNoPerspective);
  }
  local_24a = true;
  local_24c = true;
  if ((interpolation_qual->lower & 0x10000) == 0) {
    bVar6 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(local_228->super_IVariant).self.id,mbr_idx,
                       DecorationCentroid);
    local_24c = true;
    if (!bVar6) {
      local_24c = Compiler::has_decoration
                            ((Compiler *)this,(ID)(local_220->super_IVariant).self.id,
                             DecorationCentroid);
    }
  }
  if (((interpolation_qual->lower & 0x20000) == 0) &&
     (bVar6 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(local_228->super_IVariant).self.id,mbr_idx,
                         DecorationSample), !bVar6)) {
    local_24a = Compiler::has_decoration
                          ((Compiler *)this,(ID)(local_220->super_IVariant).self.id,DecorationSample
                          );
  }
  local_70.higher._M_h._M_buckets = &local_70.higher._M_h._M_single_bucket;
  local_70.lower = 0;
  local_70.higher._M_h._M_bucket_count = 1;
  local_70.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_70.higher._M_h._M_element_count = 0;
  local_70.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_70.higher._M_h._M_rehash_policy._M_next_resize = 0;
  local_70.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((byte)(local_24c | local_24a | local_24b | local_249) == 1) {
    uVar18 = (ulong)local_24b * 0x4000 + 0x2000;
    if (local_249 == false) {
      uVar18 = (ulong)local_24b * 0x4000;
    }
    uVar9 = uVar18 + 0x10000;
    if (local_24c == false) {
      uVar9 = uVar18;
    }
    local_70.lower = uVar9 | 0x20000;
    if (local_24a == false) {
      local_70.lower = uVar9;
    }
  }
  uVar2 = (local_228->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          ptr[mbr_idx].id;
  pSVar10 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar2);
  bVar6 = Compiler::is_matrix((Compiler *)this,pSVar10);
  if (bVar6) {
    bVar6 = Compiler::is_array((Compiler *)this,pSVar10);
    if (bVar6) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar17,"MSL cannot emit arrays-of-matrices in input and output variables.");
LAB_001c04d4:
      *(undefined ***)prVar17 = &PTR__runtime_error_003a2f80;
      __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_234 = pSVar10->columns;
LAB_001bf1a6:
    local_230 = (undefined4)CONCAT71((uint7)(uint3)(local_234 >> 8),1);
  }
  else {
    bVar6 = Compiler::is_array((Compiler *)this,pSVar10);
    if (bVar6) {
      if ((pSVar10->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar17,"MSL cannot emit arrays-of-arrays in input and output variables.");
        goto LAB_001c04d4;
      }
      local_234 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar10);
      goto LAB_001bf1a6;
    }
    local_234 = 1;
    local_230 = 0;
  }
  pSVar11 = pSVar10;
  if (pSVar10->pointer != false) {
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (pSVar10->parent_type).id);
  }
  while ((bVar6 = Compiler::is_array((Compiler *)this,pSVar11), bVar6 ||
         (bVar6 = Compiler::is_matrix((Compiler *)this,pSVar11), pSVar5 = local_240, bVar6))) {
    pSVar11 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + (pSVar11->parent_type).id);
  }
  flatten_from_ib_mbr_name._M_dataplus._M_p = (pointer)&flatten_from_ib_mbr_name.field_2;
  flatten_from_ib_mbr_name._M_string_length = 0;
  flatten_from_ib_mbr_name.field_2._M_local_buf[0] = '\0';
  if ((storage == StorageClassOutput) && ((builtin == BuiltInClipDistance & local_241) == 1)) {
    sVar3 = (local_240->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
            .buffer_size;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
              (&local_240->member_types,sVar3 + 1);
    sVar20 = (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
             buffer_size;
    (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
    [sVar20].id = uVar2;
    (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = sVar20 + 1;
    uVar7 = (uint32_t)sVar3;
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(pSVar5->super_IVariant).self.id,uVar7,DecorationBuiltIn,3);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&mbr_name,this,3,3);
    ::std::__cxx11::string::operator=((string *)&flatten_from_ib_mbr_name,(string *)&mbr_name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
      operator_delete(mbr_name._M_dataplus._M_p);
    }
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
               &flatten_from_ib_mbr_name);
    local_1d4 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    if ((this->msl_options).enable_clip_distance_user_varying == false) goto LAB_001c0425;
  }
  else {
    local_1d4 = 0;
  }
  if (pSVar10->basetype == Struct) {
    local_248 = 0;
    if (local_234 != 0) {
      do {
        paVar23 = &var_chain_1.field_2;
        pSVar11 = local_228;
        append_member_name(&var_chain,this,mbr_name_qual,local_228,mbr_idx);
        if ((char)local_230 == '\0') {
          var_chain_1._M_dataplus._M_p = (pointer)paVar23;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&var_chain_1,"");
        }
        else {
          join<char_const(&)[2],unsigned_int&>
                    (&var_chain_1,(spirv_cross *)0x2efe70,(char (*) [2])&local_248,(uint *)pSVar11);
        }
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain._M_dataplus._M_p != &var_chain.field_2) {
          uVar21 = var_chain.field_2._M_allocated_capacity;
        }
        pacVar22 = (char (*) [2])var_chain._M_string_length;
        if ((ulong)uVar21 < var_chain_1._M_string_length + var_chain._M_string_length) {
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)var_chain_1._M_dataplus._M_p != paVar23) {
            uVar21 = var_chain_1.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < var_chain_1._M_string_length + var_chain._M_string_length)
          goto LAB_001bf429;
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::replace
                              ((ulong)&var_chain_1,0,(char *)0x0,(ulong)var_chain._M_dataplus._M_p);
        }
        else {
LAB_001bf429:
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::_M_append
                              ((char *)&var_chain,(ulong)var_chain_1._M_dataplus._M_p);
        }
        mbr_name._M_dataplus._M_p = (pointer)&mbr_name.field_2;
        psVar1 = puVar12 + 2;
        if ((size_type *)*puVar12 == psVar1) {
          mbr_name.field_2._M_allocated_capacity = *psVar1;
          mbr_name.field_2._8_8_ = puVar12[3];
        }
        else {
          mbr_name.field_2._M_allocated_capacity = *psVar1;
          mbr_name._M_dataplus._M_p = (pointer)*puVar12;
        }
        mbr_name._M_string_length = puVar12[1];
        *puVar12 = psVar1;
        puVar12[1] = 0;
        *(char *)psVar1 = '\0';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain_1._M_dataplus._M_p != paVar23) {
          operator_delete(var_chain_1._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain._M_dataplus._M_p != &var_chain.field_2) {
          operator_delete(var_chain._M_dataplus._M_p);
        }
        CompilerGLSL::to_member_name_abi_cxx11_
                  (&var_chain_1,&this->super_CompilerGLSL,local_228,mbr_idx);
        if ((char)local_230 == '\0') {
          local_1f8._M_unused._M_object = &local_1e8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
        }
        else {
          join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                    ((string *)&local_1f8,(spirv_cross *)0x2e4336,(char (*) [2])&local_248,
                     (uint *)0x2ef80f,pacVar22);
        }
        join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string>
                  (&var_chain,(spirv_cross *)var_chain_qual,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30f749,
                   (char (*) [2])&var_chain_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3);
        if ((code **)local_1f8._M_unused._0_8_ != &local_1e8) {
          operator_delete(local_1f8._M_unused._M_object);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain_1._M_dataplus._M_p != paVar23) {
          operator_delete(var_chain_1._M_dataplus._M_p);
        }
        uVar7 = (uint32_t)
                (pSVar10->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        if (uVar7 != 0) {
          uVar19 = 0;
          do {
            ts_3 = pSVar10;
            add_composite_member_variable_to_interface_block
                      (this,storage,ib_var_ref,local_240,local_220,pSVar10,uVar19,meta,&mbr_name,
                       &var_chain,location,var_mbr_idx,&local_70);
            *var_mbr_idx = *var_mbr_idx + 1;
            uVar19 = uVar19 + 1;
          } while (uVar7 != uVar19);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain._M_dataplus._M_p != &var_chain.field_2) {
          operator_delete(var_chain._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
          operator_delete(mbr_name._M_dataplus._M_p);
        }
        local_248 = local_248 + 1;
      } while (local_248 < local_234);
    }
  }
  else {
    local_248 = 0;
    if (local_234 != 0) {
      this_00 = &local_240->member_types;
      local_c0 = &(this->pull_model_inputs)._M_h;
      local_d0 = &(this->outputs_by_builtin)._M_h;
      local_c8 = &(this->inputs_by_builtin)._M_h;
      do {
        sVar3 = (local_240->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        sVar20 = sVar3;
        if (storage == StorageClassInput) {
          mbr_name._M_dataplus._M_p._0_4_ = (local_220->super_IVariant).self.id;
          cVar13 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_c0,(key_type_conflict *)&mbr_name);
          if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
            sVar20 = (local_240->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
            goto LAB_001bf742;
          }
          uVar7 = build_msl_interpolant_type(this,(pSVar11->super_IVariant).self.id,local_249);
          sVar20 = (local_240->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        }
        else {
LAB_001bf742:
          uVar7 = (pSVar11->super_IVariant).self.id;
        }
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve(this_00,sVar20 + 1);
        sVar20 = (local_240->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        (local_240->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        [sVar20].id = uVar7;
        (local_240->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = sVar20 + 1;
        pSVar10 = local_228;
        append_member_name(&mbr_name,this,mbr_name_qual,local_228,mbr_idx);
        if ((char)local_230 == '\0') {
          var_chain_1._M_dataplus._M_p = (pointer)&var_chain_1.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&var_chain_1,"");
        }
        else {
          join<char_const(&)[2],unsigned_int&>
                    (&var_chain_1,(spirv_cross *)0x2efe70,(char (*) [2])&local_248,(uint *)pSVar10);
        }
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
          uVar21 = mbr_name.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < var_chain_1._M_string_length + mbr_name._M_string_length) {
          ts_3 = (SPIRType *)&var_chain_1.field_2;
          uVar21 = 0xf;
          if ((SPIRType *)var_chain_1._M_dataplus._M_p != ts_3) {
            uVar21 = var_chain_1.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < var_chain_1._M_string_length + mbr_name._M_string_length)
          goto LAB_001bf832;
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::replace
                              ((ulong)&var_chain_1,0,(char *)0x0,(ulong)mbr_name._M_dataplus._M_p);
        }
        else {
LAB_001bf832:
          puVar12 = (undefined8 *)
                    ::std::__cxx11::string::_M_append
                              ((char *)&mbr_name,(ulong)var_chain_1._M_dataplus._M_p);
        }
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar23) {
          local_f0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_f0.field_2._8_4_ = *(undefined4 *)(puVar12 + 3);
          local_f0.field_2._12_4_ = *(undefined4 *)((long)puVar12 + 0x1c);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_f0._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_f0._M_string_length = puVar12[1];
        *puVar12 = paVar23;
        puVar12[1] = 0;
        paVar23->_M_local_buf[0] = '\0';
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        this_01 = (CompilerMSL *)0x301079;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"m","");
        ensure_valid_name(&var_chain,this_01,&local_f0,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain_1._M_dataplus._M_p != &var_chain_1.field_2) {
          operator_delete(var_chain_1._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
          operator_delete(mbr_name._M_dataplus._M_p);
        }
        uVar7 = (uint32_t)sVar3;
        Compiler::set_member_name
                  ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,&var_chain);
        if (*location == 0xffffffff || local_241 != 0) {
          bVar6 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(local_228->super_IVariant).self.id,mbr_idx,
                             DecorationLocation);
          if (bVar6) {
            uVar19 = Compiler::get_member_decoration
                               ((Compiler *)this,(TypeID)(local_228->super_IVariant).self.id,mbr_idx
                                ,DecorationLocation);
            *location = uVar19 + local_248;
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                       DecorationLocation,uVar19 + local_248);
            mark_location_as_used_by_shader(this,*location,pSVar11,storage,false);
            goto LAB_001bfa33;
          }
          bVar6 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(local_220->super_IVariant).self.id,
                             DecorationLocation);
          if (bVar6) {
            uVar19 = CompilerGLSL::get_accumulated_member_location
                               (&this->super_CompilerGLSL,local_220,mbr_idx,meta->strip_array);
            *location = uVar19 + local_248;
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                       DecorationLocation,uVar19 + local_248);
            mark_location_as_used_by_shader(this,*location,pSVar11,storage,false);
            goto LAB_001bfa33;
          }
          if (local_241 != 0) {
            bVar6 = Compiler::is_tessellation_shader((Compiler *)this);
            if (bVar6 && storage == StorageClassInput) {
              mbr_name._M_dataplus._M_p._0_4_ = builtin;
              cVar14 = ::std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(local_c8,(key_type_conflict *)&mbr_name);
              if (cVar14.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_false>
                  ._M_cur != (__node_type *)0x0) {
                mbr_name._M_dataplus._M_p._0_4_ = builtin;
                pmVar15 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)local_c8,(key_type *)&mbr_name);
                uVar19 = local_248 + pmVar15->location;
                *location = uVar19;
                Compiler::set_member_decoration
                          ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                           DecorationLocation,uVar19);
                mark_location_as_used_by_shader(this,*location,pSVar11,StorageClassInput,false);
                goto LAB_001bfa33;
              }
            }
            else if ((storage == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) != 0)
                    ) {
              mbr_name._M_dataplus._M_p._0_4_ = builtin;
              cVar14 = ::std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(local_d0,(key_type_conflict *)&mbr_name);
              if (cVar14.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_false>
                  ._M_cur != (__node_type *)0x0) {
                mbr_name._M_dataplus._M_p._0_4_ = builtin;
                pmVar15 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)local_d0,(key_type *)&mbr_name);
                uVar19 = local_248 + pmVar15->location;
                *location = uVar19;
                Compiler::set_member_decoration
                          ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                           DecorationLocation,uVar19);
                mark_location_as_used_by_shader(this,*location,pSVar11,StorageClassOutput,false);
                goto LAB_001bfa33;
              }
            }
            if (builtin - BuiltInClipDistance < 2) {
              Compiler::set_member_decoration
                        ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                         DecorationBuiltIn,builtin);
              Compiler::set_member_decoration
                        ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                         DecorationIndex,local_248);
            }
          }
        }
        else {
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                     DecorationLocation,*location);
          mark_location_as_used_by_shader(this,*location,pSVar11,storage,false);
LAB_001bfa33:
          *location = *location + 1;
        }
        bVar6 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)(local_228->super_IVariant).self.id,mbr_idx,
                           DecorationComponent);
        if (bVar6) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar17,"DecorationComponent on matrices and arrays is not supported.");
          *(undefined ***)prVar17 = &PTR__runtime_error_003a2f80;
          __cxa_throw(prVar17,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (storage == StorageClassInput) {
          mbr_name._M_dataplus._M_p._0_4_ = (local_220->super_IVariant).self.id;
          cVar13 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(local_c0,(key_type_conflict *)&mbr_name);
          if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)
          goto LAB_001bfa90;
        }
        else {
LAB_001bfa90:
          if (local_24b != false) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                       DecorationFlat,0);
          }
          if (local_249 != false) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                       DecorationNoPerspective,0);
          }
          if (local_24c != false) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                       DecorationCentroid,0);
          }
          if (local_24a != false) {
            Compiler::set_member_decoration
                      ((Compiler *)this,(TypeID)(local_240->super_IVariant).self.id,uVar7,
                       DecorationSample,0);
          }
        }
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,(local_240->super_IVariant).self.id,uVar7,
                   SPIRVCrossDecorationInterfaceOrigID,(local_220->super_IVariant).self.id);
        pacVar22 = (char (*) [2])(ulong)*var_mbr_idx;
        Compiler::set_extended_member_decoration
                  ((Compiler *)this,(local_240->super_IVariant).self.id,uVar7,
                   SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
        if ((meta->strip_array == false) && (meta->allow_local_declaration == true)) {
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&mbr_name,&this->super_CompilerGLSL,local_228,mbr_idx);
          if ((char)local_230 == '\0') {
            local_1f8._M_unused._M_object = &local_1e8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
          }
          else {
            join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&local_1f8,(spirv_cross *)0x2e4336,(char (*) [2])&local_248,
                       (uint *)0x2ef80f,pacVar22);
          }
          join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string>
                    (&var_chain_1,(spirv_cross *)var_chain_qual,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30f749,
                     (char (*) [2])&mbr_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3);
          if ((code **)local_1f8._M_unused._0_8_ != &local_1e8) {
            operator_delete(local_1f8._M_unused._M_object);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
            operator_delete(mbr_name._M_dataplus._M_p);
          }
          if (storage == StorageClassInput) {
            mbr_name._M_dataplus._M_p = (pointer)local_220;
            mbr_name.field_2._M_local_buf[1] = local_24a;
            mbr_name.field_2._M_local_buf[0] = local_24c;
            mbr_name.field_2._8_8_ = &local_1a8;
            mbr_name._M_string_length = (size_type)this;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)((long)&mbr_name.field_2 + 8),var_chain_1._M_dataplus._M_p,
                       var_chain_1._M_dataplus._M_p + var_chain_1._M_string_length);
            local_198 = &pcStack_188;
            pcVar4 = (ib_var_ref->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_198,pcVar4,pcVar4 + ib_var_ref->_M_string_length);
            local_178 = (code *)&uStack_168;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,var_chain._M_dataplus._M_p,
                       var_chain._M_dataplus._M_p + var_chain._M_string_length);
            local_1e8 = (code *)0x0;
            pcStack_1e0 = (code *)0x0;
            local_1f8._M_unused._M_object = (void *)0x0;
            local_1f8._8_8_ = 0;
            ppcVar16 = (code **)operator_new(0x78);
            *(undefined2 *)(ppcVar16 + 2) = mbr_name.field_2._M_allocated_capacity._0_2_;
            *(BuiltIn *)ppcVar16 = (BuiltIn)mbr_name._M_dataplus._M_p;
            *(undefined4 *)((long)ppcVar16 + 4) = mbr_name._M_dataplus._M_p._4_4_;
            *(undefined4 *)(ppcVar16 + 1) = (undefined4)mbr_name._M_string_length;
            *(undefined4 *)((long)ppcVar16 + 0xc) = mbr_name._M_string_length._4_4_;
            ppcVar16[3] = (code *)(ppcVar16 + 5);
            if ((uint *)mbr_name.field_2._8_8_ == &local_1a8) {
              *(uint *)(ppcVar16 + 5) = local_1a8;
              *(undefined4 *)((long)ppcVar16 + 0x2c) = uStack_1a4;
              *(undefined4 *)(ppcVar16 + 6) = (undefined4)uStack_1a0;
              *(undefined4 *)((long)ppcVar16 + 0x34) = uStack_1a0._4_4_;
            }
            else {
              ppcVar16[3] = (code *)mbr_name.field_2._8_8_;
              ppcVar16[5] = (code *)CONCAT44(uStack_1a4,local_1a8);
            }
            ppcVar16[4] = local_1b0;
            local_1b0 = (code *)0x0;
            local_1a8 = local_1a8 & 0xffffff00;
            ppcVar16[7] = (code *)(ppcVar16 + 9);
            mbr_name.field_2._8_8_ = &local_1a8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(ppcVar16 + 7),local_198,
                       (code *)((long)local_198 + CONCAT71(uStack_18f,local_190)));
            ppcVar16[0xb] = (code *)(ppcVar16 + 0xd);
            if (local_178 == (code *)&uStack_168) {
              ppcVar16[0xd] = (code *)CONCAT71(uStack_167,uStack_168);
              ppcVar16[0xe] = (code *)CONCAT44(uStack_15c,local_160);
            }
            else {
              ppcVar16[0xb] = local_178;
              ppcVar16[0xd] = (code *)CONCAT71(uStack_167,uStack_168);
            }
            ppcVar16[0xc] = local_170;
            local_170 = (code *)0x0;
            uStack_168 = (code)0x0;
            pcStack_1e0 = ::std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3143:41)>
                          ::_M_invoke;
            local_1e8 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3143:41)>
                        ::_M_manager;
            local_1f8._M_unused._0_8_ = ppcVar16;
            local_178 = (code *)&uStack_168;
            SmallVector<std::function<void_()>,_0UL>::push_back
                      (&pSVar8->fixup_hooks_in,(function<void_()> *)&local_1f8);
            if (local_1e8 != (code *)0x0) {
              (*local_1e8)(&local_1f8,&local_1f8,3);
            }
            if (local_178 != (code *)&uStack_168) {
              operator_delete(local_178);
            }
            if (local_198 != &pcStack_188) {
              operator_delete(local_198);
            }
            uVar21 = mbr_name.field_2._8_8_;
            if ((uint *)mbr_name.field_2._8_8_ != &local_1a8) {
LAB_001c03de:
              operator_delete((void *)uVar21);
            }
          }
          else if (storage == StorageClassOutput) {
            mbr_name._M_dataplus._M_p._0_1_ = (char)local_1d4;
            mbr_name.field_2._M_allocated_capacity = (size_type)&local_1b0;
            pcVar4 = (ib_var_ref->_M_dataplus)._M_p;
            mbr_name._M_string_length = (size_type)this;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&mbr_name.field_2,pcVar4,pcVar4 + ib_var_ref->_M_string_length);
            uStack_1a0 = (code *)&local_190;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&uStack_1a0,var_chain._M_dataplus._M_p,
                       var_chain._M_dataplus._M_p + var_chain._M_string_length);
            local_180 = &local_170;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_180,flatten_from_ib_mbr_name._M_dataplus._M_p,
                       flatten_from_ib_mbr_name._M_dataplus._M_p +
                       flatten_from_ib_mbr_name._M_string_length);
            local_160 = local_248;
            local_158 = (code *)&local_148;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_158,var_chain_1._M_dataplus._M_p,
                       var_chain_1._M_dataplus._M_p + var_chain_1._M_string_length);
            local_1e8 = (code *)0x0;
            pcStack_1e0 = (code *)0x0;
            local_1f8._M_unused._M_object = (void *)0x0;
            local_1f8._8_8_ = 0;
            ppcVar16 = (code **)operator_new(0x98);
            *(BuiltIn *)ppcVar16 = (BuiltIn)mbr_name._M_dataplus._M_p;
            *(undefined4 *)((long)ppcVar16 + 4) = mbr_name._M_dataplus._M_p._4_4_;
            *(undefined4 *)(ppcVar16 + 1) = (undefined4)mbr_name._M_string_length;
            *(undefined4 *)((long)ppcVar16 + 0xc) = mbr_name._M_string_length._4_4_;
            ppcVar16[2] = (code *)(ppcVar16 + 4);
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(ppcVar16 + 2),mbr_name.field_2._M_allocated_capacity,
                       mbr_name.field_2._8_8_ + mbr_name.field_2._M_allocated_capacity);
            ppcVar16[6] = (code *)(ppcVar16 + 8);
            if (uStack_1a0 == (code *)&local_190) {
              ppcVar16[8] = (code *)CONCAT71(uStack_18f,local_190);
              ppcVar16[9] = pcStack_188;
            }
            else {
              ppcVar16[6] = uStack_1a0;
              ppcVar16[8] = (code *)CONCAT71(uStack_18f,local_190);
            }
            ppcVar16[7] = (code *)local_198;
            local_198 = (code **)0x0;
            local_190 = (code)0x0;
            ppcVar16[10] = (code *)(ppcVar16 + 0xc);
            if (local_180 == &local_170) {
              ppcVar16[0xc] = local_170;
              ppcVar16[0xd] = (code *)CONCAT71(uStack_167,uStack_168);
            }
            else {
              ppcVar16[10] = (code *)local_180;
              ppcVar16[0xc] = local_170;
            }
            ppcVar16[0xb] = local_178;
            local_178 = (code *)0x0;
            local_170 = (code *)((ulong)local_170 & 0xffffffffffffff00);
            *(uint *)(ppcVar16 + 0xe) = local_160;
            ppcVar16[0xf] = (code *)(ppcVar16 + 0x11);
            if (local_158 == (code *)&local_148) {
              ppcVar16[0x11] = (code *)CONCAT71(uStack_147,local_148);
              ppcVar16[0x12] = pcStack_140;
            }
            else {
              ppcVar16[0xf] = local_158;
              ppcVar16[0x11] = (code *)CONCAT71(uStack_147,local_148);
            }
            ppcVar16[0x10] = local_150;
            local_150 = (code *)0x0;
            local_148 = (code)0x0;
            pcStack_1e0 = ::std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3159:42)>
                          ::_M_invoke;
            local_1e8 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3159:42)>
                        ::_M_manager;
            local_1f8._M_unused._0_8_ = (undefined8)ppcVar16;
            uStack_1a0 = (code *)&local_190;
            local_180 = &local_170;
            local_158 = (code *)&local_148;
            SmallVector<std::function<void_()>,_0UL>::push_back
                      (&pSVar8->fixup_hooks_out,(function<void_()> *)&local_1f8);
            if (local_1e8 != (code *)0x0) {
              (*local_1e8)(&local_1f8,&local_1f8,3);
            }
            if (local_158 != (code *)&local_148) {
              operator_delete(local_158);
            }
            if (local_180 != &local_170) {
              operator_delete(local_180);
            }
            if (uStack_1a0 != (code *)&local_190) {
              operator_delete(uStack_1a0);
            }
            uVar21 = mbr_name.field_2._M_allocated_capacity;
            if ((code **)mbr_name.field_2._M_allocated_capacity != &local_1b0) goto LAB_001c03de;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)var_chain_1._M_dataplus._M_p != &var_chain_1.field_2) {
            operator_delete(var_chain_1._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)var_chain._M_dataplus._M_p != &var_chain.field_2) {
          operator_delete(var_chain._M_dataplus._M_p);
        }
        local_248 = local_248 + 1;
      } while (local_248 < local_234);
    }
  }
LAB_001c0425:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flatten_from_ib_mbr_name._M_dataplus._M_p != &flatten_from_ib_mbr_name.field_2) {
    operator_delete(flatten_from_ib_mbr_name._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70.higher._M_h);
  return;
}

Assistant:

void CompilerMSL::add_composite_member_variable_to_interface_block(StorageClass storage,
                                                                   const string &ib_var_ref, SPIRType &ib_type,
                                                                   SPIRVariable &var, SPIRType &var_type,
                                                                   uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                                   const string &mbr_name_qual,
                                                                   const string &var_chain_qual,
                                                                   uint32_t &location, uint32_t &var_mbr_idx,
                                                                   const Bitset &interpolation_qual)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat = interpolation_qual.get(DecorationFlat) ||
	               has_member_decoration(var_type.self, mbr_idx, DecorationFlat) ||
	               has_decoration(var.self, DecorationFlat);
	bool is_noperspective = interpolation_qual.get(DecorationNoPerspective) ||
	                        has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = interpolation_qual.get(DecorationCentroid) ||
	                   has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample = interpolation_qual.get(DecorationSample) ||
	                 has_member_decoration(var_type.self, mbr_idx, DecorationSample) ||
	                 has_decoration(var.self, DecorationSample);

	Bitset inherited_qual;
	if (is_flat)
		inherited_qual.set(DecorationFlat);
	if (is_noperspective)
		inherited_qual.set(DecorationNoPerspective);
	if (is_centroid)
		inherited_qual.set(DecorationCentroid);
	if (is_sample)
		inherited_qual.set(DecorationSample);

	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	bool mbr_is_indexable = false;
	uint32_t elem_cnt = 1;
	if (is_matrix(mbr_type))
	{
		if (is_array(mbr_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		mbr_is_indexable = true;
		elem_cnt = mbr_type.columns;
	}
	else if (is_array(mbr_type))
	{
		if (mbr_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		mbr_is_indexable = true;
		elem_cnt = to_array_size_literal(mbr_type);
	}

	auto *usable_type = &mbr_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(mbr_type_id);
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}

	// Recursively handle nested structures.
	if (mbr_type.basetype == SPIRType::Struct)
	{
		for (uint32_t i = 0; i < elem_cnt; i++)
		{
			string mbr_name = append_member_name(mbr_name_qual, var_type, mbr_idx) + (mbr_is_indexable ? join("_", i) : "");
			string var_chain = join(var_chain_qual, ".", to_member_name(var_type, mbr_idx), (mbr_is_indexable ? join("[", i, "]") : ""));
			uint32_t sub_mbr_cnt = uint32_t(mbr_type.member_types.size());
			for (uint32_t sub_mbr_idx = 0; sub_mbr_idx < sub_mbr_cnt; sub_mbr_idx++)
			{
				add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
																 var, mbr_type, sub_mbr_idx,
																 meta, mbr_name, var_chain,
																 location, var_mbr_idx, inherited_qual);
				// FIXME: Recursive structs and tessellation breaks here.
				var_mbr_idx++;
			}
		}
		return;
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
		if (storage == StorageClassInput && pull_model_inputs.count(var.self))
			ib_type.member_types.push_back(build_msl_interpolant_type(usable_type->self, is_noperspective));
		else
			ib_type.member_types.push_back(usable_type->self);

		// Give the member a name
		string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx) + (mbr_is_indexable ? join("_", i) : ""), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// Once we determine the location of the first member within nested structures,
		// from a var of the topmost structure, the remaining flattened members of
		// the nested structures will have consecutive location values. At this point,
		// we've recursively tunnelled into structs, arrays, and matrices, and are
		// down to a single location for each member now.
		if (!is_builtin && location != UINT32_MAX)
		{
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (has_member_decoration(var_type.self, mbr_idx, DecorationLocation))
		{
			location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation) + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (has_decoration(var.self, DecorationLocation))
		{
			location = get_accumulated_member_location(var, mbr_idx, meta.strip_array) + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
		{
			location = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
		{
			location = outputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
			mark_location_as_used_by_shader(location, *usable_type, storage);
			location++;
		}
		else if (is_builtin && (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance))
		{
			// Declare the Clip/CullDistance as [[user(clip/cullN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, i);
		}

		if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
			SPIRV_CROSS_THROW("DecorationComponent on matrices and arrays is not supported.");

		if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
		{
			// Copy interpolation decorations if needed
			if (is_flat)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
			if (is_noperspective)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
			if (is_centroid)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
			if (is_sample)
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
		}

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);

		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		if (!meta.strip_array && meta.allow_local_declaration)
		{
			string var_chain = join(var_chain_qual, ".", to_member_name(var_type, mbr_idx), (mbr_is_indexable ? join("[", i, "]") : ""));
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					string lerp_call;
					if (pull_model_inputs.count(var.self))
					{
						if (is_centroid)
							lerp_call = ".interpolate_at_centroid()";
						else if (is_sample)
							lerp_call = join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
						else
							lerp_call = ".interpolate_at_center()";
					}
					statement(var_chain, " = ", ib_var_ref, ".", mbr_name, lerp_call, ";");
				});
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=]() {
					if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i, "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", var_chain, ";");
				});
				break;

			default:
				break;
			}
		}
	}
}